

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O2

int64_t dist_block_px_domain
                  (AV1_COMP *cpi,MACROBLOCK *x,int plane,BLOCK_SIZE plane_bsize,int block,
                  int blk_row,int blk_col,TX_SIZE tx_size)

{
  MACROBLOCKD *xd;
  bool bVar1;
  int iVar2;
  int a_stride;
  tran_low_t *ptVar3;
  uint8_t *puVar4;
  MACROBLOCK *pMVar5;
  ulong uVar6;
  TX_TYPE tx_type;
  _func_void_uint8_t_ptr_ptrdiff_t_uint8_t_ptr_ptrdiff_t_int_int **pp_Var7;
  uint64_t uVar8;
  byte bVar9;
  uint16_t *puVar10;
  uint16_t *dst;
  int txb_cols;
  AV1_COMP *local_2068;
  MACROBLOCK *local_2060;
  ulong local_2058;
  ulong local_2050;
  int local_2048;
  int visible_rows;
  int txb_rows;
  uint32_t local_203c;
  uint16_t recon16 [4096];
  
  local_2058 = (ulong)x->plane[plane].eobs[block];
  local_2050 = (ulong)txsize_to_bsize[tx_size];
  iVar2 = (x->e_mbd).plane[plane].dst.stride;
  ptVar3 = x->plane[plane].dqcoeff;
  a_stride = x->plane[plane].src.stride;
  puVar4 = x->plane[plane].src.buf;
  xd = &x->e_mbd;
  puVar10 = (uint16_t *)((x->e_mbd).plane[plane].dst.buf + (iVar2 * blk_row + blk_col) * 4);
  if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
    pp_Var7 = &aom_convolve_copy;
    dst = recon16;
  }
  else {
    dst = (uint16_t *)((ulong)recon16 >> 1);
    puVar10 = (uint16_t *)((long)puVar10 * 2);
    pp_Var7 = (_func_void_uint8_t_ptr_ptrdiff_t_uint8_t_ptr_ptrdiff_t_int_int **)
              &aom_highbd_convolve_copy;
  }
  local_2068 = cpi;
  local_2060 = x;
  (**pp_Var7)(puVar10,(long)iVar2,recon16,0x40,(int)block_size_wide[local_2050],
              (int)block_size_high[local_2050]);
  puVar4 = puVar4 + (a_stride * blk_row + blk_col) * 4;
  bVar1 = (local_2068->common).features.reduced_tx_set_used;
  tx_type = av1_get_tx_type(xd,plane != 0,blk_row,blk_col,tx_size,(uint)bVar1);
  av1_inverse_transform_block
            (xd,ptVar3 + (block << 4),plane,tx_type,tx_size,(uint8_t *)dst,0x40,(int)local_2058,
             (uint)bVar1);
  uVar6 = local_2050;
  get_txb_dimensions(xd,plane,plane_bsize,blk_row,blk_col,(BLOCK_SIZE)local_2050,&txb_cols,&txb_rows
                     ,&local_2048,&visible_rows);
  pMVar5 = local_2060;
  if ((txb_rows == visible_rows) && (txb_cols == local_2048)) {
    (*local_2068->ppi->fn_ptr[uVar6].vf)(puVar4,a_stride,(uint8_t *)dst,0x40,&local_203c);
  }
  else if ((((local_2060->e_mbd).cur_buf)->flags & 8) == 0) {
    local_203c = aom_sse_odd_size(puVar4,a_stride,(uint8_t *)dst,0x40,local_2048,visible_rows);
  }
  else {
    uVar8 = aom_highbd_sse_odd_size(puVar4,a_stride,(uint8_t *)dst,0x40,local_2048,visible_rows);
    bVar9 = (char)(pMVar5->e_mbd).bd * '\x02' - 0x10;
    local_203c = (uint32_t)(((uint)(1 << (bVar9 & 0x1f)) >> 1) + uVar8 >> (bVar9 & 0x3f));
  }
  return (ulong)(local_203c << 4);
}

Assistant:

static inline int64_t dist_block_px_domain(const AV1_COMP *cpi, MACROBLOCK *x,
                                           int plane, BLOCK_SIZE plane_bsize,
                                           int block, int blk_row, int blk_col,
                                           TX_SIZE tx_size) {
  MACROBLOCKD *const xd = &x->e_mbd;
  const struct macroblock_plane *const p = &x->plane[plane];
  const uint16_t eob = p->eobs[block];
  const BLOCK_SIZE tx_bsize = txsize_to_bsize[tx_size];
  const int bsw = block_size_wide[tx_bsize];
  const int bsh = block_size_high[tx_bsize];
  const int src_stride = x->plane[plane].src.stride;
  const int dst_stride = xd->plane[plane].dst.stride;
  // Scale the transform block index to pixel unit.
  const int src_idx = (blk_row * src_stride + blk_col) << MI_SIZE_LOG2;
  const int dst_idx = (blk_row * dst_stride + blk_col) << MI_SIZE_LOG2;
  const uint8_t *src = &x->plane[plane].src.buf[src_idx];
  const uint8_t *dst = &xd->plane[plane].dst.buf[dst_idx];
  const tran_low_t *dqcoeff = p->dqcoeff + BLOCK_OFFSET(block);

  assert(cpi != NULL);
  assert(tx_size_wide_log2[0] == tx_size_high_log2[0]);

  uint8_t *recon;
  DECLARE_ALIGNED(16, uint16_t, recon16[MAX_TX_SQUARE]);

#if CONFIG_AV1_HIGHBITDEPTH
  if (is_cur_buf_hbd(xd)) {
    recon = CONVERT_TO_BYTEPTR(recon16);
    aom_highbd_convolve_copy(CONVERT_TO_SHORTPTR(dst), dst_stride,
                             CONVERT_TO_SHORTPTR(recon), MAX_TX_SIZE, bsw, bsh);
  } else {
    recon = (uint8_t *)recon16;
    aom_convolve_copy(dst, dst_stride, recon, MAX_TX_SIZE, bsw, bsh);
  }
#else
  recon = (uint8_t *)recon16;
  aom_convolve_copy(dst, dst_stride, recon, MAX_TX_SIZE, bsw, bsh);
#endif

  const PLANE_TYPE plane_type = get_plane_type(plane);
  TX_TYPE tx_type = av1_get_tx_type(xd, plane_type, blk_row, blk_col, tx_size,
                                    cpi->common.features.reduced_tx_set_used);
  av1_inverse_transform_block(xd, dqcoeff, plane, tx_type, tx_size, recon,
                              MAX_TX_SIZE, eob,
                              cpi->common.features.reduced_tx_set_used);

  return 16 * pixel_dist(cpi, x, plane, src, src_stride, recon, MAX_TX_SIZE,
                         blk_row, blk_col, plane_bsize, tx_bsize);
}